

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningAgent.cpp
# Opt level: O2

void __thiscall
multi_agent_planning::idp_visitor<unsigned_long>::
examine_vertex<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>const>
          (idp_visitor<unsigned_long> *this,unsigned_long u,
          adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
          *g)

{
  pointer puVar1;
  undefined8 uVar2;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>::config>_>
  *in_R8;
  unsigned_long v;
  pair<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_bool> local_40;
  
  if (this->m_goal != u) {
    *this->time = 0;
    puVar1 = (this->p->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (; (boost *)u != (boost *)puVar1[u]; u = puVar1[u]) {
      boost::
      edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>::config>>
                (&local_40,(boost *)puVar1[u],u,(vertex_descriptor)g,in_R8);
      *this->time = *this->time + 1;
      puVar1 = (this->p->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    return;
  }
  uVar2 = __cxa_allocate_exception(1);
  __cxa_throw(uVar2,&found_goal::typeinfo,0);
}

Assistant:

void examine_vertex(Vertex u, Graph& g) {
    if(u == m_goal)
      throw found_goal();
    
    time = 0;
    for (Vertex v = u; v != p[v]; v = p[v]) {
    	Vertex s = p[v];
    	Edge e = edge(s, v, g).first;
    	time++;
    }
  }